

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O3

void opj_tcd_makelayer_fixed(opj_tcd_t *tcd,OPJ_UINT32 layno,OPJ_UINT32 final)

{
  uint uVar1;
  OPJ_UINT32 OVar2;
  uint uVar3;
  opj_tcd_tile_t *poVar4;
  opj_cp_t *poVar5;
  opj_tcd_tilecomp_t *poVar6;
  OPJ_INT32 *pOVar7;
  opj_tcd_resolution_t *poVar8;
  opj_tcd_precinct_t *poVar9;
  opj_tcd_cblk_enc_t *poVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  int *piVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  ulong uVar24;
  int iVar25;
  long lVar26;
  ulong uVar27;
  int *piVar28;
  OPJ_INT32 matrice [10] [10] [3];
  int local_4e8 [302];
  
  poVar4 = tcd->tcd_image->tiles;
  uVar16 = (ulong)poVar4->numcomps;
  if (uVar16 != 0) {
    poVar5 = tcd->cp;
    poVar6 = poVar4->comps;
    uVar12 = (ulong)tcd->tcp->numlayers;
    uVar13 = 0;
    do {
      uVar1 = poVar6[uVar13].numresolutions;
      uVar17 = (ulong)uVar1;
      if (uVar12 != 0) {
        iVar21 = 0;
        piVar20 = local_4e8;
        uVar24 = 0;
        do {
          if (uVar17 != 0) {
            uVar14 = tcd->image->comps[uVar13].prec;
            pOVar7 = (poVar5->m_specific_param).m_enc.m_matrice;
            uVar27 = 0;
            piVar28 = piVar20;
            iVar22 = iVar21;
            do {
              lVar26 = 0;
              do {
                piVar28[lVar26] =
                     (int)((float)pOVar7[(uint)(iVar22 + (int)lVar26)] *
                          (float)((double)uVar14 * 0.0625));
                lVar26 = lVar26 + 1;
              } while (lVar26 != 3);
              uVar27 = uVar27 + 1;
              piVar28 = piVar28 + 3;
              iVar22 = iVar22 + 3;
            } while (uVar27 != uVar17);
          }
          uVar24 = uVar24 + 1;
          piVar20 = piVar20 + 0x1e;
          iVar21 = iVar21 + uVar1 * 3;
        } while (uVar24 != uVar12);
      }
      if (uVar17 != 0) {
        poVar8 = poVar6[uVar13].resolutions;
        uVar24 = 0;
        do {
          uVar1 = poVar8[uVar24].numbands;
          if ((ulong)uVar1 != 0) {
            uVar27 = 0;
            do {
              if (((poVar8[uVar24].bands[uVar27].x1 != poVar8[uVar24].bands[uVar27].x0) &&
                  (poVar8[uVar24].bands[uVar27].y1 != poVar8[uVar24].bands[uVar27].y0)) &&
                 (uVar14 = poVar8[uVar24].ph * poVar8[uVar24].pw, uVar14 != 0)) {
                poVar9 = poVar8[uVar24].bands[uVar27].precincts;
                uVar19 = 0;
                do {
                  uVar15 = poVar9[uVar19].ch * poVar9[uVar19].cw;
                  if (uVar15 != 0) {
                    OVar2 = tcd->image->comps[uVar13].prec;
                    iVar21 = local_4e8[(ulong)layno * 0x1e + uVar24 * 3 + uVar27];
                    lVar26 = 0;
                    do {
                      poVar10 = poVar9[uVar19].cblks.enc;
                      iVar22 = OVar2 - *(int *)((long)&poVar10->numbps + lVar26);
                      if (layno == 0) {
                        iVar25 = iVar21 - iVar22;
                        if (iVar25 == 0 || iVar21 < iVar22) {
                          iVar25 = 0;
                        }
                        *(undefined4 *)((long)&poVar10->numpassesinlayers + lVar26) = 0;
                      }
                      else {
                        iVar23 = local_4e8[(ulong)(layno - 1) * 0x1e + uVar24 * 3 + uVar27];
                        iVar25 = iVar21 - iVar23;
                        if (iVar23 - iVar22 == 0 || iVar23 < iVar22) {
                          iVar25 = (iVar23 - iVar22) + (iVar21 - iVar23);
                          if (iVar25 < 1) {
                            iVar25 = 0;
                          }
                        }
                      }
                      piVar20 = (int *)((ulong)layno * 0x18 +
                                       *(long *)((long)&poVar10->layers + lVar26));
                      iVar22 = *(int *)((long)&poVar10->numpassesinlayers + lVar26);
                      if (iVar22 == 0) {
                        iVar23 = iVar25 * 3 + -2;
                        if (iVar25 != 0) {
                          iVar25 = iVar23;
                        }
                        *piVar20 = iVar25;
                        if (iVar25 != 0) {
                          piVar20[1] = *(int *)(*(long *)((long)&poVar10->passes + lVar26) +
                                               (ulong)(iVar25 - 1) * 0x18);
                          lVar18 = *(long *)((long)&poVar10->data + lVar26);
                          goto LAB_001367a4;
                        }
                      }
                      else {
                        iVar11 = iVar25 * 3;
                        *piVar20 = iVar11;
                        if (iVar25 != 0) {
                          lVar18 = *(long *)((long)&poVar10->passes + lVar26);
                          iVar23 = iVar11 + iVar22;
                          uVar3 = *(uint *)(lVar18 + (ulong)(iVar22 - 1) * 0x18);
                          piVar20[1] = *(int *)(lVar18 + (ulong)((iVar11 + iVar22) - 1) * 0x18) -
                                       uVar3;
                          lVar18 = (ulong)uVar3 + *(long *)((long)&poVar10->data + lVar26);
LAB_001367a4:
                          *(long *)(piVar20 + 4) = lVar18;
                          if (final != 0) {
                            *(int *)((long)&poVar10->numpassesinlayers + lVar26) = iVar23;
                          }
                        }
                      }
                      lVar26 = lVar26 + 0x40;
                    } while ((ulong)uVar15 << 6 != lVar26);
                  }
                  uVar19 = uVar19 + 1;
                } while (uVar19 != uVar14);
              }
              uVar27 = uVar27 + 1;
            } while (uVar27 != uVar1);
          }
          uVar24 = uVar24 + 1;
        } while (uVar24 != uVar17);
      }
      uVar13 = uVar13 + 1;
    } while (uVar13 != uVar16);
  }
  return;
}

Assistant:

void opj_tcd_makelayer_fixed(opj_tcd_t *tcd, OPJ_UINT32 layno,
                             OPJ_UINT32 final)
{
    OPJ_UINT32 compno, resno, bandno, precno, cblkno;
    OPJ_INT32 value;                        /*, matrice[tcd_tcp->numlayers][tcd_tile->comps[0].numresolutions][3]; */
    OPJ_INT32 matrice[10][10][3];
    OPJ_UINT32 i, j, k;

    opj_cp_t *cp = tcd->cp;
    opj_tcd_tile_t *tcd_tile = tcd->tcd_image->tiles;
    opj_tcp_t *tcd_tcp = tcd->tcp;

    for (compno = 0; compno < tcd_tile->numcomps; compno++) {
        opj_tcd_tilecomp_t *tilec = &tcd_tile->comps[compno];

        for (i = 0; i < tcd_tcp->numlayers; i++) {
            for (j = 0; j < tilec->numresolutions; j++) {
                for (k = 0; k < 3; k++) {
                    matrice[i][j][k] =
                        (OPJ_INT32)((OPJ_FLOAT32)cp->m_specific_param.m_enc.m_matrice[i *
                                      tilec->numresolutions * 3 + j * 3 + k]
                                    * (OPJ_FLOAT32)(tcd->image->comps[compno].prec / 16.0));
                }
            }
        }

        for (resno = 0; resno < tilec->numresolutions; resno++) {
            opj_tcd_resolution_t *res = &tilec->resolutions[resno];

            for (bandno = 0; bandno < res->numbands; bandno++) {
                opj_tcd_band_t *band = &res->bands[bandno];

                /* Skip empty bands */
                if (opj_tcd_is_band_empty(band)) {
                    continue;
                }

                for (precno = 0; precno < res->pw * res->ph; precno++) {
                    opj_tcd_precinct_t *prc = &band->precincts[precno];

                    for (cblkno = 0; cblkno < prc->cw * prc->ch; cblkno++) {
                        opj_tcd_cblk_enc_t *cblk = &prc->cblks.enc[cblkno];
                        opj_tcd_layer_t *layer = &cblk->layers[layno];
                        OPJ_UINT32 n;
                        OPJ_INT32 imsb = (OPJ_INT32)(tcd->image->comps[compno].prec -
                                                     cblk->numbps); /* number of bit-plan equal to zero */

                        /* Correction of the matrix of coefficient to include the IMSB information */
                        if (layno == 0) {
                            value = matrice[layno][resno][bandno];
                            if (imsb >= value) {
                                value = 0;
                            } else {
                                value -= imsb;
                            }
                        } else {
                            value = matrice[layno][resno][bandno] - matrice[layno - 1][resno][bandno];
                            if (imsb >= matrice[layno - 1][resno][bandno]) {
                                value -= (imsb - matrice[layno - 1][resno][bandno]);
                                if (value < 0) {
                                    value = 0;
                                }
                            }
                        }

                        if (layno == 0) {
                            cblk->numpassesinlayers = 0;
                        }

                        n = cblk->numpassesinlayers;
                        if (cblk->numpassesinlayers == 0) {
                            if (value != 0) {
                                n = 3 * (OPJ_UINT32)value - 2 + cblk->numpassesinlayers;
                            } else {
                                n = cblk->numpassesinlayers;
                            }
                        } else {
                            n = 3 * (OPJ_UINT32)value + cblk->numpassesinlayers;
                        }

                        layer->numpasses = n - cblk->numpassesinlayers;

                        if (!layer->numpasses) {
                            continue;
                        }

                        if (cblk->numpassesinlayers == 0) {
                            layer->len = cblk->passes[n - 1].rate;
                            layer->data = cblk->data;
                        } else {
                            layer->len = cblk->passes[n - 1].rate - cblk->passes[cblk->numpassesinlayers -
                                         1].rate;
                            layer->data = cblk->data + cblk->passes[cblk->numpassesinlayers - 1].rate;
                        }

                        if (final) {
                            cblk->numpassesinlayers = n;
                        }
                    }
                }
            }
        }
    }
}